

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

TestSuite *
iutest::detail::
TypeParamTestInstance<test::string_assertion_test::iu_StrTest_x_iutest_x_NeNull_L_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>,_void>::AddTestSuite
          (char *testsuite,size_t index,char *file,int line)

{
  UnitTest *this;
  TypeId id;
  SetUpTearDownTestSuiteFuncType setup;
  SetUpTearDownTestSuiteFuncType teardown;
  TestSuite *pTVar1;
  undefined4 in_register_0000000c;
  size_t index_00;
  string local_48;
  int local_24;
  char *pcStack_20;
  int line_local;
  char *file_local;
  size_t index_local;
  char *testsuite_local;
  
  index_00 = CONCAT44(in_register_0000000c,line);
  local_24 = line;
  pcStack_20 = file;
  file_local = (char *)index;
  index_local = (size_t)testsuite;
  this = UnitTest::instance();
  MakeIndexTestName_abi_cxx11_(&local_48,(detail *)index_local,file_local,index_00);
  id = internal::GetTypeId<iutest::detail::None>();
  setup = legacy::
          SuiteApiResolver<test::string_assertion_test::iu_StrTest_x_iutest_x_NeNull_L_Test<char>_>
          ::GetSetUpCaseOrSuite(pcStack_20,local_24);
  teardown = legacy::
             SuiteApiResolver<test::string_assertion_test::iu_StrTest_x_iutest_x_NeNull_L_Test<char>_>
             ::GetTearDownCaseOrSuite(pcStack_20,local_24);
  pTVar1 = UnitTestImpl::AddTestSuite<iutest::TypedTestSuite<char>>
                     (&this->super_UnitTestImpl,&local_48,id,setup,teardown);
  std::__cxx11::string::~string((string *)&local_48);
  return pTVar1;
}

Assistant:

static TestSuite* AddTestSuite(const char* testsuite, size_t index, const char* file, int line)
        {
#if !defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
            return UnitTest::instance().AddTestSuite<_MyTestSuite>(
#else
            return UnitTest::instance().AddTestSuite(
#endif
#if IUTEST_HAS_TYPED_TEST_APPEND_TYPENAME
                detail::MakeIndexTypedTestName<TypeParam>(testsuite, index)
#else
                detail::MakeIndexTestName(testsuite, index)
#endif
                , internal::GetTypeId<detail::None>()   // TypeId を統一するためダミー引数を渡す
                , IUTEST_GET_SETUP_TESTSUITE(TestBody, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(TestBody, file, line)
#if defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
                , detail::explicit_type<_MyTestSuite>()
#endif
                );
        }